

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsysmp.cpp
# Opt level: O0

void __thiscall
TPZSYsmpMatrix<double>::AutoFill
          (TPZSYsmpMatrix<double> *this,int64_t nrow,int64_t ncol,int symmetric)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  reference plVar4;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  TPZMatrix<double> *in_RDI;
  pair<std::_Rb_tree_const_iterator<long>,_bool> pVar5;
  iterator col_1;
  int64_t row_1;
  int64_t pos;
  REAL test;
  int64_t col;
  int64_t row;
  TPZVec<std::set<long,_std::less<long>,_std::allocator<long>_>_> eqs;
  TPZStack<double,_10> A;
  TPZStack<long,_10> JA;
  TPZVec<long> IA;
  TPZFMatrix<double> orig;
  set<long,_std::less<long>,_std::allocator<long>_> *in_stack_fffffffffffffd18;
  TPZVec<long> *in_stack_fffffffffffffd20;
  _Rb_tree_const_iterator<long> *in_stack_fffffffffffffd28;
  TPZStack<double,_10> *in_stack_fffffffffffffd30;
  double *in_stack_fffffffffffffd38;
  TPZFMatrix<double> *in_stack_fffffffffffffd40;
  int64_t in_stack_fffffffffffffd48;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd57;
  undefined8 in_stack_fffffffffffffd88;
  int64_t in_stack_fffffffffffffd90;
  int64_t in_stack_fffffffffffffd98;
  TPZMatrix<double> *this_00;
  _Self local_248;
  _Self local_240;
  TPZStack<double,_10> *local_238;
  undefined8 local_230;
  _Base_ptr local_228;
  undefined1 local_220;
  _Base_ptr local_218;
  undefined1 local_210;
  double local_208;
  long local_200;
  _Base_ptr local_1f8;
  undefined1 local_1f0;
  int64_t local_1e8;
  TPZVec<std::set<long,_std::less<long>,_std::allocator<long>_>_> local_1e0;
  undefined1 local_1c0 [112];
  TPZVec<long> local_150 [3];
  TPZVec<long> local_e0;
  TPZMatrix<double> local_b0 [4];
  int local_1c;
  long local_18;
  long local_10;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if ((in_ECX == 0) || (in_RSI != in_RDX)) {
    pzinternal::DebugStopImpl
              ((char *)A.super_TPZManVector<double,_10>.super_TPZVec<double>.fNAlloc,
               A.super_TPZManVector<double,_10>.super_TPZVec<double>.fNElements);
  }
  this_00 = local_b0;
  TPZFMatrix<double>::TPZFMatrix
            ((TPZFMatrix<double> *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
  TPZMatrix<double>::AutoFill(this_00,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,iVar2);
  TPZVec<long>::TPZVec(in_stack_fffffffffffffd20,(int64_t)in_stack_fffffffffffffd18);
  TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)in_stack_fffffffffffffd30);
  TPZStack<double,_10>::TPZStack(in_stack_fffffffffffffd30);
  plVar3 = TPZVec<long>::operator[](&local_e0,0);
  *plVar3 = 0;
  TPZVec<std::set<long,_std::less<long>,_std::allocator<long>_>_>::TPZVec
            ((TPZVec<std::set<long,_std::less<long>,_std::allocator<long>_>_> *)
             CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),in_stack_fffffffffffffd48
            );
  for (local_1e8 = 0; local_1e8 < local_10; local_1e8 = local_1e8 + 1) {
    TPZVec<std::set<long,_std::less<long>,_std::allocator<long>_>_>::operator[]
              (&local_1e0,local_1e8);
    pVar5 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                      ((set<long,_std::less<long>,_std::allocator<long>_> *)
                       in_stack_fffffffffffffd40,(value_type_conflict5 *)in_stack_fffffffffffffd38);
    local_1f8 = (_Base_ptr)pVar5.first._M_node;
    local_1f0 = pVar5.second;
    for (local_200 = 0; local_200 < local_18; local_200 = local_200 + 1) {
      iVar2 = rand();
      local_208 = ((double)iVar2 * 1.0) / 2147483647.0;
      if (0.5 < local_208) {
        TPZVec<std::set<long,_std::less<long>,_std::allocator<long>_>_>::operator[]
                  (&local_1e0,local_1e8);
        pVar5 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                          ((set<long,_std::less<long>,_std::allocator<long>_> *)
                           in_stack_fffffffffffffd40,
                           (value_type_conflict5 *)in_stack_fffffffffffffd38);
        local_218 = (_Base_ptr)pVar5.first._M_node;
        local_210 = pVar5.second;
        if (local_1c != 0) {
          TPZVec<std::set<long,_std::less<long>,_std::allocator<long>_>_>::operator[]
                    (&local_1e0,local_200);
          pVar5 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                            ((set<long,_std::less<long>,_std::allocator<long>_> *)
                             in_stack_fffffffffffffd40,
                             (value_type_conflict5 *)in_stack_fffffffffffffd38);
          local_228 = (_Base_ptr)pVar5.first._M_node;
          local_220 = pVar5.second;
        }
      }
    }
  }
  local_230 = 0;
  for (local_238 = (TPZStack<double,_10> *)0x0; (long)local_238 < local_10;
      local_238 = (TPZStack<double,_10> *)
                  ((long)&(local_238->super_TPZManVector<double,_10>).super_TPZVec<double>.
                          _vptr_TPZVec + 1)) {
    TPZVec<std::set<long,_std::less<long>,_std::allocator<long>_>_>::operator[]
              (&local_1e0,(int64_t)local_238);
    local_240._M_node =
         (_Base_ptr)
         std::set<long,_std::less<long>,_std::allocator<long>_>::begin(in_stack_fffffffffffffd18);
    while( true ) {
      in_stack_fffffffffffffd40 =
           (TPZFMatrix<double> *)
           TPZVec<std::set<long,_std::less<long>,_std::allocator<long>_>_>::operator[]
                     (&local_1e0,(int64_t)local_238);
      local_248._M_node =
           (_Base_ptr)
           std::set<long,_std::less<long>,_std::allocator<long>_>::end(in_stack_fffffffffffffd18);
      bVar1 = std::operator!=(&local_240,&local_248);
      if (!bVar1) break;
      plVar4 = std::_Rb_tree_const_iterator<long>::operator*
                         ((_Rb_tree_const_iterator<long> *)0x1390b3d);
      if ((long)local_238 <= *plVar4) {
        std::_Rb_tree_const_iterator<long>::operator*((_Rb_tree_const_iterator<long> *)0x1390b57);
        TPZStack<long,_10>::Push
                  ((TPZStack<long,_10> *)in_stack_fffffffffffffd30,(long)in_stack_fffffffffffffd28);
        in_stack_fffffffffffffd30 = local_238;
        std::_Rb_tree_const_iterator<long>::operator*((_Rb_tree_const_iterator<long> *)0x1390b83);
        in_stack_fffffffffffffd38 =
             TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                        (int64_t)in_stack_fffffffffffffd30);
        TPZStack<double,_10>::Push(in_stack_fffffffffffffd30,(double)in_stack_fffffffffffffd28);
      }
      std::_Rb_tree_const_iterator<long>::operator++
                (in_stack_fffffffffffffd28,(int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
    }
    in_stack_fffffffffffffd28 = (_Rb_tree_const_iterator<long> *)TPZVec<long>::size(local_150);
    in_stack_fffffffffffffd20 =
         (TPZVec<long> *)
         TPZVec<long>::operator[]
                   (&local_e0,
                    (int64_t)((long)&(local_238->super_TPZManVector<double,_10>).
                                     super_TPZVec<double>._vptr_TPZVec + 1));
    in_stack_fffffffffffffd20->_vptr_TPZVec = (_func_int **)in_stack_fffffffffffffd28;
  }
  TPZMatrix<double>::Resize(in_RDI,local_10,local_18);
  (*(in_RDI->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4f])
            (in_RDI,&local_e0,local_150,local_1c0);
  TPZVec<std::set<long,_std::less<long>,_std::allocator<long>_>_>::~TPZVec
            ((TPZVec<std::set<long,_std::less<long>,_std::allocator<long>_>_> *)
             in_stack_fffffffffffffd40);
  TPZStack<double,_10>::~TPZStack((TPZStack<double,_10> *)0x1390c97);
  TPZStack<long,_10>::~TPZStack((TPZStack<long,_10> *)0x1390ca4);
  TPZVec<long>::~TPZVec(in_stack_fffffffffffffd20);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1390cbe);
  return;
}

Assistant:

void TPZSYsmpMatrix<TVar>::AutoFill(int64_t nrow, int64_t ncol, int symmetric)
{
    if (!symmetric || nrow != ncol) {
        DebugStop();
    }
    TPZFMatrix<TVar> orig;
    orig.AutoFill(nrow,ncol,symmetric);
    
    TPZVec<int64_t> IA(nrow+1);
    TPZStack<int64_t> JA;
    TPZStack<TVar> A;
    IA[0] = 0;
    TPZVec<std::set<int64_t> > eqs(nrow);
    for (int64_t row=0; row<nrow; row++) {
        eqs[row].insert(row);
        for (int64_t col = 0; col<ncol; col++) {
            REAL test = rand()*1./RAND_MAX;
            if (test > 0.5) {
                eqs[row].insert(col);
                if (symmetric) {
                    eqs[col].insert(row);
                }
            }
        }
    }
    int64_t pos=0;
    for (int64_t row=0; row< nrow; row++) {
        for (std::set<int64_t>::iterator col = eqs[row].begin(); col != eqs[row].end(); col++) {
            if(*col >= row)
            {
                JA.Push(*col);
                A.Push(orig(row,*col));
            }
        }
        IA[row+1] = JA.size();
    }
    TPZMatrix<TVar>::Resize(nrow,ncol);
    SetData(IA, JA, A);
}